

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setTriggeringComponent
          (XMLSchemaDescriptionImpl *this,QName *trigComponent)

{
  QName *this_00;
  
  if (this->fTriggeringComponent != (QName *)0x0) {
    (*(this->fTriggeringComponent->super_XSerializable)._vptr_XSerializable[1])();
    this->fTriggeringComponent = (QName *)0x0;
  }
  this_00 = (QName *)XMemory::operator_new(0x48,trigComponent->fMemoryManager);
  QName::QName(this_00,trigComponent);
  this->fTriggeringComponent = this_00;
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setTriggeringComponent(QName* const trigComponent)
{ 
    if ( fTriggeringComponent) {
        delete fTriggeringComponent;
        fTriggeringComponent = 0;
    }
    
    fTriggeringComponent = new (trigComponent->getMemoryManager()) QName(*trigComponent); 

}